

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O1

bool __thiscall JtagTAP_Controller::AdvanceState(JtagTAP_Controller *this,BitState tms_state)

{
  JtagTAPState JVar1;
  JtagTAPState JVar2;
  JtagTAPStateChange *pJVar3;
  
  JVar1 = this->mCurrTAPState;
  pJVar3 = tap_state_change_map + JVar1;
  if (tms_state == BIT_HIGH) {
    pJVar3 = (JtagTAPStateChange *)&tap_state_change_map[JVar1].tms_high_change;
  }
  JVar2 = pJVar3->tms_low_change;
  this->mCurrTAPState = JVar2;
  return JVar2 != JVar1;
}

Assistant:

bool JtagTAP_Controller::AdvanceState( BitState tms_state )
{
    JtagTAPState new_state;

    if( tms_state == BIT_HIGH )
        new_state = tap_state_change_map[ mCurrTAPState ].tms_high_change;
    else
        new_state = tap_state_change_map[ mCurrTAPState ].tms_low_change;

    bool ret_val = new_state != mCurrTAPState;

    mCurrTAPState = new_state;

    return ret_val;
}